

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)>::
UntypedPerformDefaultAction
          (FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this,void *untyped_args,
          string *call_description)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  pointer pcVar4;
  undefined1 uVar5;
  UntypedActionResultHolderBase *pUVar6;
  OnCallSpec<bool_(long,_(anonymous_namespace)::TestValue_*)> *pOVar7;
  FailureReporterInterface *pFVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  ArgumentTuple local_58;
  long local_48 [2];
  long local_38;
  
  pUVar6 = (UntypedActionResultHolderBase *)operator_new(0x10);
  pOVar7 = FindOnCallSpec(this,(ArgumentTuple *)untyped_args);
  if (pOVar7 == (OnCallSpec<bool_(long,_(anonymous_namespace)::TestValue_*)> *)0x0) {
    pcVar4 = (call_description->_M_dataplus)._M_p;
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl =
         (_Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>)
         (_Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar4,pcVar4 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    if (DefaultValue<bool>::producer_ == (long *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (**(code **)(*DefaultValue<bool>::producer_ + 0x10))();
    }
    if (local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
        super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
        super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl !=
        (TestValue *)local_48) {
      operator_delete((void *)local_58.
                              super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
                              super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>.
                              _M_head_impl,local_48[0] + 1);
    }
  }
  else {
    iVar1 = *(int *)(pOVar7 + 0xc);
    local_38 = 0x3a;
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl =
         (_Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>)
         (_Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>)local_48;
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl =
         (_Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>)
         std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
    local_48[0] = local_38;
    builtin_strncpy((char *)((long)&((TestValue *)
                                    ((long)local_58.
                                           super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>
                                           .
                                           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>
                                           .
                                           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>
                                           ._M_head_impl + 0x28))->dummy + 2),"in an ON",8);
    builtin_strncpy((char *)((long)&((TestValue *)
                                    ((long)local_58.
                                           super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>
                                           .
                                           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>
                                           .
                                           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>
                                           ._M_head_impl + 0x30))->dummy + 2),"_CALL().",8);
    ((TestValue *)
    ((long)local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl + 0x20))->
    dummy = 0x636e6f20796c7463;
    ((TestValue *)
    ((long)local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl + 0x28))->
    dummy = 0x206e61206e692065;
    ((TestValue *)
    ((long)local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl + 0x10))->
    dummy = 0x7061207473756d20;
    ((TestValue *)
    ((long)local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl + 0x18))->
    dummy = 0x6178652072616570;
    ((TestValue *)
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl)->dummy =
         0x4479426c6c69572e;
    ((TestValue *)
    ((long)local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
           super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
           super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl + 8))->
    dummy = 0x2928746c75616665;
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<0UL,_long,_false>._M_head_impl = local_38;
    *(undefined1 *)
     ((long)&((TestValue *)
             local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
             super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
             super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl)->dummy +
     local_38) = 0;
    if (iVar1 != 2) {
      uVar2 = *(uint *)(pOVar7 + 8);
      uVar3 = *(undefined8 *)pOVar7;
      pFVar8 = GetFailureReporter();
      (*pFVar8->_vptr_FailureReporterInterface[2])(pFVar8,1,uVar3,(ulong)uVar2,&local_58);
    }
    if (local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
        super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
        super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl !=
        (TestValue *)local_48) {
      operator_delete((void *)local_58.
                              super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
                              super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>.
                              _M_head_impl,local_48[0] + 1);
    }
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<1UL,_(anonymous_namespace)::TestValue_*,_false>._M_head_impl = *untyped_args;
    local_58.super__Tuple_impl<0UL,_long,_(anonymous_namespace)::TestValue_*>.
    super__Head_base<0UL,_long,_false>._M_head_impl = *(long *)((long)untyped_args + 8);
    uVar5 = Action<bool_(long,_(anonymous_namespace)::TestValue_*)>::Perform
                      ((Action<bool_(long,_(anonymous_namespace)::TestValue_*)> *)(pOVar7 + 0x58),
                       &local_58);
  }
  pUVar6->_vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00194410;
  *(undefined1 *)&pUVar6[1]._vptr_UntypedActionResultHolderBase = uVar5;
  return pUVar6;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformDefaultAction(
      void* untyped_args,  // must point to an ArgumentTuple
      const std::string& call_description) const override {
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformDefaultAction(this, std::move(*args),
                                              call_description);
  }